

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

double __thiscall
ProbabEstimator::getProbabLtFast1
          (ProbabEstimator *this,double maxValInReplaced,int numReplaced,int pathLength)

{
  int in_EDX;
  int in_ESI;
  ProbabEstimator *in_RDI;
  double in_XMM0_Qa;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double val;
  double vals [20];
  double cPAr1;
  double PAr1;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  double local_d0;
  double local_c8 [20];
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_20 = DistribFunction::getDistrib(in_RDI->distribFunction,in_XMM0_Qa);
  local_28 = 1.0 - local_20;
  local_c8[0] = 1.0;
  local_d0 = 1.0;
  for (local_d4 = 0; local_d4 < local_14; local_d4 = local_d4 + 1) {
    local_c8[local_d4] = local_d0;
    local_d0 = ((double)(local_18 - local_d4) / (double)(local_d4 + 1)) * local_d0;
  }
  local_d0 = local_28;
  for (local_d8 = 1; local_d8 < local_14; local_d8 = local_d8 + 1) {
    local_c8[local_d8] = local_d0 * local_c8[local_d8];
    local_d0 = local_28 * local_d0;
  }
  local_d0 = pown(in_RDI,local_20,(local_18 - local_14) + 1);
  local_dc = local_14;
  while (local_dc = local_dc + -1, -1 < local_dc) {
    local_c8[local_dc] = local_d0 * local_c8[local_dc];
    local_d0 = local_20 * local_d0;
  }
  local_d0 = 0.0;
  for (local_e0 = 0; local_e0 < local_14; local_e0 = local_e0 + 1) {
    local_d0 = local_c8[local_e0] + local_d0;
  }
  return local_d0;
}

Assistant:

double ProbabEstimator::getProbabLtFast1( const double maxValInReplaced, const int numReplaced, const int pathLength ){
    double  PAr1 = distribFunction->getDistrib( maxValInReplaced );
    double cPAr1 = 1.0-PAr1;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i < numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr1; 
    for ( int i = 1; i < numReplaced; ++i ){ vals[i] *= val; val *= cPAr1; }
    val = pown( PAr1, pathLength-numReplaced+1 );
    for ( int i = numReplaced-1; i >= 0; --i ){ vals[i] *= val; val *= PAr1; }
    val = 0.0;
    for ( int i = 0; i < numReplaced; ++i ) val += vals[i];
    return val;
}